

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void assign_area_vnum(int vnum)

{
  AREA_DATA_conflict *pAVar1;
  uint uVar2;
  uint uVar3;
  short sVar4;
  
  pAVar1 = area_last;
  sVar4 = (short)vnum;
  if ((area_last->min_vnum == 0) ||
     (uVar2 = (uint)(ushort)area_last->max_vnum, uVar3 = (uint)(ushort)area_last->min_vnum,
     area_last->max_vnum == 0)) {
    area_last->max_vnum = sVar4;
    pAVar1->min_vnum = sVar4;
    uVar2 = vnum;
    uVar3 = vnum;
  }
  if (vnum < (short)uVar3) {
    pAVar1->min_vnum = sVar4;
    return;
  }
  if ((short)uVar2 < vnum) {
    pAVar1->max_vnum = sVar4;
  }
  return;
}

Assistant:

void assign_area_vnum(int vnum)
{
	if (area_last->min_vnum == 0 || area_last->max_vnum == 0)
		area_last->min_vnum = area_last->max_vnum = vnum;

	if (vnum != URANGE(area_last->min_vnum, vnum, area_last->max_vnum))
	{
		if (vnum < area_last->min_vnum)
			area_last->min_vnum = vnum;
		else
			area_last->max_vnum = vnum;
	}
}